

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture2DArrayFilteringTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture2DArrayFilteringTestInstance *this)

{
  int green;
  int blue;
  int iVar1;
  deUint32 dVar2;
  deUint32 height;
  TestContext *pTVar3;
  TestLog *this_00;
  reference pvVar4;
  TestTexture2DArray *pTVar5;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  reference pvVar7;
  TestTexture2DArray *pTVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int *piVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_type sVar10;
  float fVar11;
  Texture2DArrayView TVar12;
  bool local_8f1;
  Vector<float,_3> *local_850;
  allocator<char> local_841;
  string local_840;
  undefined4 local_820;
  allocator<char> local_819;
  string local_818;
  MessageBuilder local_7f8;
  Texture2DArrayView local_678;
  ConstPixelBufferAccess local_668;
  undefined1 local_639;
  undefined1 local_638 [7];
  bool isOk;
  Vector<int,_3> local_4b4;
  Texture2DArrayView local_4a8;
  ConstPixelBufferAccess local_498;
  undefined1 local_46d;
  float local_46c;
  undefined1 auStack_468 [3];
  bool isHighQuality;
  int iStack_464;
  int local_460;
  Vector<int,_3> local_45c;
  Vector<float,_4> local_450;
  tcu local_440 [8];
  float afStack_438 [2];
  undefined1 local_430 [8];
  LookupPrecision lookupPrecision;
  LodPrecision lodPrecision;
  Vector<int,_4> local_3e4;
  Vector<int,_4> local_3d4;
  undefined1 local_3c4 [8];
  IVec4 colorBits;
  PixelFormat pixelFormat;
  undefined1 local_39c [8];
  IVec4 formatBitDepth;
  float fStack_384;
  bool isNearestOnly;
  Vector<float,_3> local_37c;
  Vector<float,_3> local_370;
  Vector<float,_3> local_364;
  float local_358;
  float local_354;
  float l1;
  float l0;
  float sY;
  float sX;
  float oY;
  float oX;
  float lodY;
  float lodX;
  float local_1b8 [3];
  Sampler local_1ac;
  float *local_170;
  float *texCoordPtr;
  undefined1 local_158 [8];
  Vec3 texCoord [4];
  Surface rendered;
  ReferenceParams refParams;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  TestTexture2DArray *texture;
  FilterCase *curCase;
  TestLog *log;
  Texture2DArrayFilteringTestInstance *this_local;
  
  pTVar3 = Context::getTestContext((this->super_TestInstance).m_context);
  this_00 = tcu::TestContext::getLog(pTVar3);
  pvVar4 = std::
           vector<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase>_>
           ::operator[](&this->m_cases,(long)this->m_caseNdx);
  pTVar5 = util::TextureRenderer::get2DArrayTexture(&this->m_renderer,pvVar4->textureIndex);
  iVar1 = (*(pTVar5->super_TestTexture)._vptr_TestTexture[0xe])();
  fmtInfo.lookupBias.m_data._8_8_ = *(undefined8 *)CONCAT44(extraout_var,iVar1);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&refParams.baseLevel,
             (TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),TEXTURETYPE_2D_ARRAY);
  dVar2 = util::TextureRenderer::getRenderWidth(&this->m_renderer);
  height = util::TextureRenderer::getRenderHeight(&this->m_renderer);
  tcu::Surface::Surface((Surface *)(texCoord[3].m_data + 1),dVar2,height);
  local_850 = (Vector<float,_3> *)local_158;
  do {
    tcu::Vector<float,_3>::Vector(local_850);
    local_850 = local_850 + 1;
  } while (local_850 != (Vector<float,_3> *)(texCoord[3].m_data + 1));
  local_170 = (float *)local_158;
  util::createSampler(&local_1ac,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  tcu::Sampler::operator=((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_1ac)
  ;
  local_1b8[0] = fmtInfo.lookupBias.m_data[2];
  local_1b8[1] = fmtInfo.lookupBias.m_data[3];
  glu::TextureTestUtil::getSamplerType((TextureFormat)fmtInfo.lookupBias.m_data._8_8_);
  refParams.sampler.seamlessCubeMap = false;
  refParams.sampler._53_3_ = 0;
  refParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  refParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  refParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  refParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  refParams.super_RenderParams.bias = fmtInfo.valueMax.m_data[2];
  refParams.super_RenderParams.ref = fmtInfo.valueMax.m_data[3];
  refParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  refParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  tcu::TestLog::operator<<
            ((MessageBuilder *)&lodY,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&lodY,(char (*) [28])"Approximate lod per axis = ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&pvVar4->lod);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", offset = ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&pvVar4->offset);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&lodY);
  oX = tcu::Vector<float,_2>::x(&pvVar4->lod);
  oY = tcu::Vector<float,_2>::y(&pvVar4->lod);
  sX = tcu::Vector<float,_2>::x(&pvVar4->offset);
  sY = tcu::Vector<float,_2>::y(&pvVar4->offset);
  fVar11 = deFloatExp2(oX);
  dVar2 = util::TextureRenderer::getRenderWidth(&this->m_renderer);
  pvVar7 = std::
           vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
           ::operator[](&this->m_textures,0);
  pTVar8 = de::SharedPtr<vkt::pipeline::TestTexture2DArray>::operator->(pvVar7);
  iVar1 = (*(pTVar8->super_TestTexture)._vptr_TestTexture[0x11])();
  iVar1 = tcu::Texture2DArray::getWidth((Texture2DArray *)CONCAT44(extraout_var_00,iVar1));
  l0 = (fVar11 * (float)dVar2) / (float)iVar1;
  fVar11 = deFloatExp2(oY);
  dVar2 = util::TextureRenderer::getRenderHeight(&this->m_renderer);
  pvVar7 = std::
           vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
           ::operator[](&this->m_textures,0);
  pTVar8 = de::SharedPtr<vkt::pipeline::TestTexture2DArray>::operator->(pvVar7);
  iVar1 = (*(pTVar8->super_TestTexture)._vptr_TestTexture[0x11])();
  iVar1 = tcu::Texture2DArray::getHeight((Texture2DArray *)CONCAT44(extraout_var_01,iVar1));
  l1 = (fVar11 * (float)dVar2) / (float)iVar1;
  local_354 = tcu::Vector<float,_2>::x(&pvVar4->layerRange);
  local_358 = tcu::Vector<float,_2>::y(&pvVar4->layerRange);
  tcu::Vector<float,_3>::Vector(&local_364,sX,sY,local_354);
  texCoord[0].m_data[0] = local_364.m_data[2];
  local_158._0_4_ = local_364.m_data[0];
  local_158._4_4_ = local_364.m_data[1];
  tcu::Vector<float,_3>::Vector(&local_370,sX,sY + l1,local_354 * 0.5 + local_358 * 0.5);
  texCoord[1].m_data[0] = local_370.m_data[2];
  texCoord[0].m_data[1] = local_370.m_data[0];
  texCoord[0].m_data[2] = local_370.m_data[1];
  tcu::Vector<float,_3>::Vector(&local_37c,sX + l0,sY,local_354 * 0.5 + local_358 * 0.5);
  texCoord[2].m_data[0] = local_37c.m_data[2];
  texCoord[1].m_data[1] = local_37c.m_data[0];
  texCoord[1].m_data[2] = local_37c.m_data[1];
  tcu::Vector<float,_3>::Vector
            ((Vector<float,_3> *)(formatBitDepth.m_data + 3),sX + l0,sY + l1,local_358);
  texCoord[2].m_data[1] = (float)formatBitDepth.m_data[3];
  texCoord[2].m_data[2] = fStack_384;
  util::TextureRenderer::renderQuad
            (&this->m_renderer,(Surface *)(texCoord[3].m_data + 1),pvVar4->textureIndex,local_170,
             (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4));
  local_8f1 = false;
  if ((this->m_testParameters).super_Texture2DTestCaseParameters.
      super_TextureCommonTestCaseParameters.minFilter == NEAREST) {
    local_8f1 = (this->m_testParameters).super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.magFilter == NEAREST;
  }
  formatBitDepth.m_data[2]._3_1_ = local_8f1;
  pixelFormat._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)local_39c,(TextureFormat *)&pixelFormat.blueBits);
  piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_39c,0);
  iVar1 = *piVar9;
  piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_39c,1);
  green = *piVar9;
  piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_39c,2);
  blue = *piVar9;
  piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_39c,3);
  tcu::PixelFormat::PixelFormat((PixelFormat *)(colorBits.m_data + 2),iVar1,green,blue,*piVar9);
  glu::TextureTestUtil::getBitsVec
            ((TextureTestUtil *)&local_3e4,(PixelFormat *)(colorBits.m_data + 2));
  tcu::operator-((tcu *)&local_3d4,&local_3e4,2 - (formatBitDepth.m_data[2]._3_1_ & 1));
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&lodPrecision.derivateBits,0);
  tcu::max<int,4>((tcu *)local_3c4,&local_3d4,(Vector<int,_4> *)&lodPrecision.derivateBits);
  tcu::LodPrecision::LodPrecision((LodPrecision *)&lookupPrecision.colorMask,RULE_VULKAN);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_430);
  lodPrecision.rule = 6;
  tcu::computeFixedPointThreshold((tcu *)&local_450,(IVec4 *)local_3c4);
  tcu::operator/(local_440,&local_450,(Vector<float,_4> *)&refParams.super_RenderParams.bias);
  lookupPrecision.uvwBits.m_data._4_8_ = local_440;
  lookupPrecision.colorThreshold.m_data[0] = afStack_438[0];
  lookupPrecision.colorThreshold.m_data[1] = afStack_438[1];
  tcu::Vector<int,_3>::Vector(&local_45c,0x14,0x14,0x14);
  lookupPrecision.coordBits.m_data[0] = local_45c.m_data[2];
  local_430._0_4_ = local_45c.m_data[0];
  local_430._4_4_ = local_45c.m_data[1];
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_468,7,7,0);
  lookupPrecision.uvwBits.m_data[0] = local_460;
  lookupPrecision.coordBits.m_data[1] = _auStack_468;
  lookupPrecision.coordBits.m_data[2] = iStack_464;
  glu::TextureTestUtil::getCompareMask
            ((TextureTestUtil *)&local_46c,(PixelFormat *)(colorBits.m_data + 2));
  lookupPrecision.colorThreshold.m_data[2] = local_46c;
  pTVar3 = Context::getTestContext((this->super_TestInstance).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_498,(Surface *)(texCoord[3].m_data + 1));
  iVar1 = (*(pTVar5->super_TestTexture)._vptr_TestTexture[0x10])();
  TVar12 = tcu::Texture2DArray::operator_cast_to_Texture2DArrayView
                     ((Texture2DArray *)CONCAT44(extraout_var_02,iVar1));
  local_4a8.m_levels = TVar12.m_levels;
  local_4a8.m_numLevels = TVar12.m_numLevels;
  local_46d = glu::TextureTestUtil::verifyTextureResult
                        (pTVar3,&local_498,&local_4a8,local_170,
                         (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),
                         (LookupPrecision *)local_430,(LodPrecision *)&lookupPrecision.colorMask,
                         (PixelFormat *)(colorBits.m_data + 2));
  if (!(bool)local_46d) {
    lodPrecision.rule = 4;
    tcu::Vector<int,_3>::Vector(&local_4b4,4,4,0);
    lookupPrecision.uvwBits.m_data[0] = local_4b4.m_data[2];
    lookupPrecision.coordBits.m_data[1] = local_4b4.m_data[0];
    lookupPrecision.coordBits.m_data[2] = local_4b4.m_data[1];
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_638,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_638,
                        (char (*) [98])
                        "Warning: Verification against high precision requirements failed, trying with lower requirements."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_638);
    pTVar3 = Context::getTestContext((this->super_TestInstance).m_context);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_668,(Surface *)(texCoord[3].m_data + 1));
    iVar1 = (*(pTVar5->super_TestTexture)._vptr_TestTexture[0x10])();
    TVar12 = tcu::Texture2DArray::operator_cast_to_Texture2DArrayView
                       ((Texture2DArray *)CONCAT44(extraout_var_03,iVar1));
    local_678.m_levels = TVar12.m_levels;
    local_678.m_numLevels = TVar12.m_numLevels;
    local_639 = glu::TextureTestUtil::verifyTextureResult
                          (pTVar3,&local_668,&local_678,local_170,
                           (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),
                           (LookupPrecision *)local_430,(LodPrecision *)&lookupPrecision.colorMask,
                           (PixelFormat *)(colorBits.m_data + 2));
    if (!(bool)local_639) {
      tcu::TestLog::operator<<(&local_7f8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_7f8,
                          (char (*) [82])
                          "ERROR: Verification against low precision requirements failed, failing test case."
                         );
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_818,"Image verification failed",&local_819);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_818);
      std::__cxx11::string::~string((string *)&local_818);
      std::allocator<char>::~allocator(&local_819);
      goto LAB_00ec35c9;
    }
  }
  this->m_caseNdx = this->m_caseNdx + 1;
  iVar1 = this->m_caseNdx;
  sVar10 = std::
           vector<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase>_>
           ::size(&this->m_cases);
  if (iVar1 < (int)sVar10) {
    tcu::TestStatus::incomplete();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"Pass",&local_841);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_840);
    std::__cxx11::string::~string((string *)&local_840);
    std::allocator<char>::~allocator(&local_841);
  }
LAB_00ec35c9:
  local_820 = 1;
  tcu::Surface::~Surface((Surface *)(texCoord[3].m_data + 1));
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus Texture2DArrayFilteringTestInstance::iterate (void)
{
	tcu::TestLog&						log			= m_context.getTestContext().getLog();

	const FilterCase&					curCase		= m_cases[m_caseNdx];
	const pipeline::TestTexture2DArray&	texture		= m_renderer.get2DArrayTexture(curCase.textureIndex);
	const tcu::TextureFormat			texFmt		= texture.getTextureFormat();
	const tcu::TextureFormatInfo		fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	ReferenceParams						refParams	(TEXTURETYPE_2D_ARRAY);
	tcu::Surface						rendered	(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	tcu::Vec3							texCoord[4];
	const float* const					texCoordPtr	= (const float*)&texCoord[0];

	// Params for reference computation.

	refParams.sampler		= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	log << TestLog::Message << "Approximate lod per axis = " << curCase.lod << ", offset = " << curCase.offset << TestLog::EndMessage;

	{
		const float	lodX	= curCase.lod.x();
		const float	lodY	= curCase.lod.y();
		const float	oX		= curCase.offset.x();
		const float	oY		= curCase.offset.y();
		const float	sX		= deFloatExp2(lodX) * float(m_renderer.getRenderWidth()) / float(m_textures[0]->getTexture().getWidth());
		const float	sY		= deFloatExp2(lodY) * float(m_renderer.getRenderHeight()) / float(m_textures[0]->getTexture().getHeight());
		const float	l0		= curCase.layerRange.x();
		const float	l1		= curCase.layerRange.y();

		texCoord[0] = tcu::Vec3(oX,		oY,		l0);
		texCoord[1] = tcu::Vec3(oX,		oY+sY,	l0*0.5f + l1*0.5f);
		texCoord[2] = tcu::Vec3(oX+sX,	oY,		l0*0.5f + l1*0.5f);
		texCoord[3] = tcu::Vec3(oX+sX,	oY+sY,	l1);
	}

	m_renderer.renderQuad(rendered, curCase.textureIndex, texCoordPtr, refParams);

	{

		const bool				isNearestOnly	= m_testParameters.minFilter == Sampler::NEAREST && m_testParameters.magFilter == Sampler::NEAREST;
		const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_VULKAN);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 18;
		lodPrecision.lodBits			= 6;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,20);
		lookupPrecision.uvwBits			= tcu::IVec3(7,7,0);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isHighQuality = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::Texture2DArrayView)texture.getTexture(),
													   texCoordPtr, refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			// Evaluate against lower precision requirements.
			lodPrecision.lodBits	= 4;
			lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

			log << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

			const bool isOk = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::Texture2DArrayView)texture.getTexture(),
												  texCoordPtr, refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				log << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				return tcu::TestStatus::fail("Image verification failed");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}